

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O1

void e2e_crash_recover_test(bool do_rollback)

{
  fdb_status fVar1;
  int iVar2;
  time_t tVar3;
  storage_t *st;
  size_t valuelen;
  char *pcVar4;
  char cVar5;
  long lVar6;
  fdb_kvs_handle *pfVar7;
  fdb_file_handle *ptr_fhandle;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  fdb_kvs_handle **ppfVar12;
  undefined7 in_register_00000039;
  idx_prams_t *params;
  checkpoint_t *pcVar13;
  fdb_kvs_handle **ppfVar14;
  storage_t *psVar15;
  fdb_kvs_handle **ptr_handle;
  uint64_t num_markers;
  fdb_snapshot_info_t *markers;
  fdb_kvs_handle *snap_db;
  fdb_kvs_config kvs_config;
  idx_prams_t index_params;
  timeval __test_begin;
  fdb_kvs_info info;
  fdb_config fconfig;
  checkpoint_t verification_checkpoint;
  fdb_file_handle fStackY_f80;
  undefined1 auStackY_f58 [24];
  timeval tStackY_f40;
  fdb_kvs_handle *apfStackY_f30 [16];
  pthread_t apStackY_eb0 [16];
  char acStackY_e30 [72];
  fdb_config fStackY_de8;
  void *apvStackY_cf0 [17];
  fdb_kvs_handle *pfStackY_c68;
  char *pcStackY_c60;
  ulong uStackY_c58;
  fdb_kvs_handle **ppfStackY_c50;
  char *pcStackY_c48;
  code *pcStackY_c40;
  fdb_file_handle *pfStack_c30;
  fdb_iterator *pfStack_c28;
  fdb_kvs_handle *pfStack_c20;
  fdb_kvs_handle *apfStack_c18 [9];
  timeval tStack_bd0;
  undefined1 auStack_bc0 [216];
  char acStack_ae8 [64];
  fdb_config fStack_aa8;
  long lStack_9b0;
  char *pcStack_9a8;
  code *pcStack_9a0;
  fdb_config *pfStack_998;
  char *pcStack_990;
  code *pcStack_988;
  fdb_kvs_config fStack_978;
  timeval tStack_960;
  fdb_file_handle *apfStack_950 [16];
  fdb_kvs_handle *apfStack_8d0 [16];
  pthread_t apStack_850 [16];
  char acStack_7d0 [64];
  void *apvStack_790 [16];
  fdb_config fStack_710;
  ulong uStack_618;
  idx_prams_t *piStack_610;
  checkpoint_t *pcStack_608;
  storage_t *psStack_600;
  storage_t *psStack_5f8;
  code *pcStack_5f0;
  checkpoint_t *local_5e0;
  fdb_snapshot_info_t *local_5d8;
  fdb_kvs_handle *local_5d0;
  fdb_kvs_config local_5c8;
  idx_prams_t local_5b0;
  timeval local_598;
  undefined1 local_588 [76];
  undefined4 local_53c;
  undefined1 local_537;
  undefined4 local_534;
  undefined1 local_529;
  checkpoint_t local_460;
  
  uVar10 = CONCAT71(in_register_00000039,do_rollback) & 0xffffffff;
  pcStack_5f0 = (code *)0x108543;
  gettimeofday(&local_598,(__timezone_ptr_t)0x0);
  pcStack_5f0 = (code *)0x108548;
  memleak_start();
  pcStack_5f0 = (code *)0x10854f;
  tVar3 = time((time_t *)0x0);
  pcStack_5f0 = (code *)0x108556;
  srand((uint)tVar3);
  pcStack_5f0 = (code *)0x10855b;
  rm_storage_fs();
  pcStack_5f0 = (code *)0x108568;
  fdb_get_default_kvs_config();
  pcStack_5f0 = (code *)0x108578;
  fdb_get_default_config();
  local_534 = 1;
  local_529 = 0;
  local_537 = 2;
  local_53c._0_1_ = '\x1e';
  local_53c._1_1_ = '\0';
  local_53c._2_1_ = false;
  local_53c._3_1_ = false;
  params = &local_5b0;
  pcStack_5f0 = (code *)0x10859f;
  gen_index_params(params);
  pcVar13 = &local_460;
  pcStack_5f0 = (code *)0x1085b6;
  memset(pcVar13,0,0x430);
  pcStack_5f0 = (code *)0x1085d0;
  st = init_storage((fdb_config *)(local_588 + 0x30),(fdb_config *)(local_588 + 0x30),&local_5c8,
                    params,pcVar13,true);
  uVar9 = 100;
  do {
    pcStack_5f0 = (code *)0x1085e3;
    load_persons(st);
    pcStack_5f0 = (code *)0x1085f0;
    e2e_fdb_commit(st->main,true);
    uVar8 = (int)uVar9 - 1;
    uVar9 = (ulong)uVar8;
  } while (uVar8 != 0);
  pcStack_5f0 = (code *)0x108606;
  fVar1 = fdb_get_all_snap_markers(st->main,&local_5d8,(uint64_t *)&local_5e0);
  cVar5 = (char)uVar10;
  psVar15 = st;
  if (cVar5 != '\0') {
    if (fVar1 == FDB_RESULT_SUCCESS) {
      if (local_5e0 != (checkpoint_t *)0x0) {
        psVar15 = (storage_t *)&st->all_docs;
        params = (idx_prams_t *)0x10;
        pcVar13 = (checkpoint_t *)0x0;
        do {
          pcStack_5f0 = (code *)0x10863e;
          fVar1 = fdb_rollback((fdb_kvs_handle **)psVar15,
                               *(fdb_seqnum_t *)
                                (*(long *)(params->min + (long)&local_5d8->marker) + 8));
          if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001087e8;
          pcVar13 = (checkpoint_t *)(pcVar13->key + 10);
          params = params + 10;
        } while (pcVar13 < local_5e0);
      }
      goto LAB_00108688;
    }
    goto LAB_001087ed;
  }
  if (fVar1 == FDB_RESULT_SUCCESS) {
    if (local_5e0 != (checkpoint_t *)0x0) {
      pcVar13 = (checkpoint_t *)0x0;
      do {
        pcStack_5f0 = (code *)0x10867a;
        load_persons(st);
        pcVar13 = (checkpoint_t *)(pcVar13->key + 10);
      } while (pcVar13 < local_5e0);
    }
LAB_00108688:
    pcStack_5f0 = (code *)0x108692;
    fdb_free_snap_markers(local_5d8,(uint64_t)local_5e0);
    pcStack_5f0 = (code *)0x10869a;
    e2e_fdb_close(st);
    pcStack_5f0 = (code *)0x1086a6;
    corrupt_latest_superblock("e2edb_main");
    pcStack_5f0 = (code *)0x1086b3;
    gen_index_params(&local_5b0);
    pcVar13 = (checkpoint_t *)0x0;
    pcStack_5f0 = (code *)0x1086cd;
    memset(&local_460,0,0x430);
    pcStack_5f0 = (code *)0x1086ee;
    st = init_storage((fdb_config *)(local_588 + 0x30),(fdb_config *)(local_588 + 0x30),&local_5c8,
                      &local_5b0,&local_460,true);
    psVar15 = (storage_t *)local_588;
    params = (idx_prams_t *)&local_5d0;
    do {
      pcStack_5f0 = (code *)0x108703;
      load_persons(st);
      uVar9 = 100;
      do {
        pcStack_5f0 = (code *)0x108710;
        load_persons(st);
        pcStack_5f0 = (code *)0x10871d;
        e2e_fdb_commit(st->main,true);
        pcStack_5f0 = (code *)0x108729;
        fVar1 = fdb_get_kvs_info(st->all_docs,(fdb_kvs_info *)psVar15);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          pcStack_5f0 = (code *)0x1087e8;
          e2e_crash_recover_test();
          goto LAB_001087e8;
        }
        pcStack_5f0 = (code *)0x108742;
        fdb_snapshot_open(st->all_docs,(fdb_kvs_handle **)params,local_588._8_8_);
        pcStack_5f0 = (code *)0x10874f;
        update_index(st,true);
        pcStack_5f0 = (code *)0x108757;
        verify_db(st);
        pcStack_5f0 = (code *)0x108761;
        fdb_kvs_close(local_5d0);
        uVar8 = (int)uVar9 - 1;
        uVar9 = (ulong)uVar8;
      } while (uVar8 != 0);
      iVar2 = (int)pcVar13;
      pcVar13 = (checkpoint_t *)(ulong)(iVar2 + 1);
      if (iVar2 != 0) {
        pcStack_5f0 = (code *)0x108779;
        e2e_fdb_shutdown(st);
        pcStack_5f0 = (code *)0x10877e;
        memleak_end();
        if (cVar5 == '\0') {
          if ((e2e_crash_recover_test(bool)::__test_pass & 1) == 0) {
            pcVar11 = "%s PASSED\n";
          }
          else {
            pcVar11 = "%s FAILED\n";
          }
          pcVar4 = "TEST: e2e crash recover test";
        }
        else {
          if ((e2e_crash_recover_test(bool)::__test_pass & 1) == 0) {
            pcVar11 = "%s PASSED\n";
          }
          else {
            pcVar11 = "%s FAILED\n";
          }
          pcVar4 = "TEST: e2e crash recover test with rollback";
        }
        pcStack_5f0 = (code *)0x1087d1;
        fprintf(_stderr,pcVar11,pcVar4);
        return;
      }
    } while( true );
  }
LAB_001087f2:
  pcStack_5f0 = e2e_multi_dbfile_concurrent_wr;
  e2e_crash_recover_test();
  pcStack_988 = (code *)0x108814;
  uStack_618 = uVar10;
  piStack_610 = params;
  pcStack_608 = pcVar13;
  psStack_600 = st;
  psStack_5f8 = psVar15;
  pcStack_5f0 = (code *)uVar9;
  gettimeofday(&tStack_960,(__timezone_ptr_t)0x0);
  pcStack_988 = (code *)0x108819;
  memleak_start();
  pcStack_988 = (code *)0x108820;
  tVar3 = time((time_t *)0x0);
  pcStack_988 = (code *)0x108827;
  srand((uint)tVar3);
  pcStack_988 = (code *)0x10882c;
  rm_storage_fs();
  pcStack_988 = (code *)0x108838;
  system("rm -rf  e2edb_ex* > errorlog.txt");
  pcStack_988 = (code *)0x108848;
  fdb_get_default_config();
  pcStack_988 = (code *)0x108852;
  fdb_get_default_kvs_config();
  fStack_710.compaction_mode = '\0';
  lVar6 = 0;
  uVar10 = 0;
  while( true ) {
    pcStack_988 = (code *)0x108882;
    sprintf(acStack_7d0,"e2edb_ex%d",uVar10);
    pcStack_988 = (code *)0x108895;
    fVar1 = fdb_open((fdb_file_handle **)((long)apfStack_950 + lVar6),acStack_7d0,&fStack_710);
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    pcStack_988 = (code *)0x1088b7;
    fVar1 = fdb_kvs_open_default
                      (*(fdb_file_handle **)((long)apfStack_950 + lVar6),
                       (fdb_kvs_handle **)((long)apfStack_8d0 + lVar6),&fStack_978);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcStack_988 = (code *)0x10897d;
      e2e_multi_dbfile_concurrent_wr();
      break;
    }
    pcStack_988 = (code *)0x1088dc;
    pthread_create((pthread_t *)((long)apStack_850 + lVar6),(pthread_attr_t *)0x0,update_thread,
                   *(void **)((long)apfStack_8d0 + lVar6));
    uVar10 = (ulong)((int)uVar10 + 1);
    lVar6 = lVar6 + 8;
    if (lVar6 == 0x80) {
      lVar6 = 0;
      do {
        pcStack_988 = (code *)0x108905;
        pthread_join(*(pthread_t *)((long)apStack_850 + lVar6),(void **)((long)apvStack_790 + lVar6)
                    );
        pcStack_988 = (code *)0x108914;
        fdb_commit(*(fdb_file_handle **)((long)apfStack_950 + lVar6),'\x01');
        pcStack_988 = (code *)0x10891e;
        fdb_close(*(fdb_file_handle **)((long)apfStack_950 + lVar6));
        lVar6 = lVar6 + 8;
      } while (lVar6 != 0x80);
      pcStack_988 = (code *)0x108930;
      fdb_shutdown();
      pcStack_988 = (code *)0x108935;
      memleak_end();
      pcVar11 = "%s PASSED\n";
      if (e2e_multi_dbfile_concurrent_wr()::__test_pass != '\0') {
        pcVar11 = "%s FAILED\n";
      }
      pcStack_988 = (code *)0x108966;
      fprintf(_stderr,pcVar11,"TEST: e2e multi dbfile concurrent wr");
      return;
    }
  }
  pcStack_988 = e2e_multi_kvs_concurrent_wr;
  e2e_multi_dbfile_concurrent_wr();
  pcStack_990 = "e2edb_ex%d";
  pcStack_9a0 = update_thread;
  pcStackY_c40 = (code *)0x10899f;
  lStack_9b0 = lVar6;
  pcStack_9a8 = acStack_7d0;
  pfStack_998 = &fStack_710;
  pcStack_988 = (code *)uVar10;
  gettimeofday(&tStack_bd0,(__timezone_ptr_t)0x0);
  pcStackY_c40 = (code *)0x1089a4;
  memleak_start();
  pfStack_c20 = (fdb_kvs_handle *)0x0;
  pcStackY_c40 = (code *)0x1089b4;
  tVar3 = time((time_t *)0x0);
  pcStackY_c40 = (code *)0x1089bb;
  srand((uint)tVar3);
  pcStackY_c40 = (code *)0x1089c0;
  rm_storage_fs();
  pcStackY_c40 = (code *)0x1089cc;
  system("rm -rf  e2edb_main > errorlog.txt");
  pcStackY_c40 = (code *)0x1089dc;
  fdb_get_default_config();
  fStack_aa8.num_keeping_headers = 10;
  pfVar7 = (fdb_kvs_handle *)auStack_bc0;
  pcStackY_c40 = (code *)0x1089f4;
  fdb_get_default_kvs_config();
  fStack_aa8.compaction_mode = '\0';
  pcStackY_c40 = (code *)0x108a0d;
  fdb_open(&pfStack_c30,"e2edb_main",&fStack_aa8);
  ppfVar14 = apfStack_c18;
  pcVar4 = "e2edb_kv%d";
  pcVar11 = auStack_bc0 + 0x58;
  uVar9 = 0;
  do {
    pcStackY_c40 = (code *)0x108a34;
    sprintf(pcVar11,"e2edb_kv%d",uVar9 & 0xffffffff);
    pcStackY_c40 = (code *)0x108a47;
    fVar1 = fdb_kvs_open(pfStack_c30,ppfVar14,pcVar11,(fdb_kvs_config *)pfVar7);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00108c84;
    uVar9 = uVar9 + 1;
    ppfVar14 = ppfVar14 + 1;
  } while (uVar9 != 8);
  ppfVar14 = (fdb_kvs_handle **)(auStack_bc0 + 0x58);
  pcVar11 = acStack_ae8;
  uVar10 = 0;
  do {
    uVar9 = 0;
    do {
      pcStackY_c40 = (code *)0x108a87;
      sprintf((char *)ppfVar14,"%dkey%d",uVar10,uVar9 & 0xffffffff);
      pcStackY_c40 = (code *)0x108a9a;
      sprintf(pcVar11,"commit%d",uVar10);
      pfVar7 = apfStack_c18[uVar9];
      pcStackY_c40 = (code *)0x108aa7;
      pcVar4 = (char *)strlen((char *)ppfVar14);
      pcStackY_c40 = (code *)0x108ab2;
      valuelen = strlen(pcVar11);
      pcStackY_c40 = (code *)0x108ac6;
      fVar1 = fdb_set_kv(pfVar7,ppfVar14,(size_t)pcVar4,pcVar11,valuelen);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcStackY_c40 = (code *)0x108c7f;
        e2e_multi_kvs_concurrent_wr();
        goto LAB_00108c7f;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != 8);
    pcStackY_c40 = (code *)0x108ae6;
    fVar1 = fdb_commit(pfStack_c30,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00108c89;
    uVar8 = (int)uVar10 + 1;
    uVar10 = (ulong)uVar8;
  } while (uVar8 != 10);
  lVar6 = 0;
  do {
    pcStackY_c40 = (code *)0x108b1d;
    pthread_create((pthread_t *)(auStack_bc0 + lVar6 + 0x18),(pthread_attr_t *)0x0,update_thread,
                   *(void **)((long)apfStack_c18 + lVar6));
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x40);
  pfVar7 = (fdb_kvs_handle *)0x0;
  do {
    pcStackY_c40 = (code *)0x108b41;
    pthread_join(*(pthread_t *)((long)&pfVar7->kvs + (long)auStack_bc0),
                 (void **)(auStack_bc0 + 0x28 + (long)&(pfVar7->config).chunksize));
    pcStackY_c40 = (code *)0x108b53;
    fVar1 = fdb_rollback((fdb_kvs_handle **)((long)apfStack_c18 + (long)pfVar7),7);
    ppfVar14 = (fdb_kvs_handle **)0x40;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00108c8e;
    pfVar7 = (fdb_kvs_handle *)&(pfVar7->kvs_config).custom_cmp;
  } while (pfVar7 != (fdb_kvs_handle *)0x40);
  pcStackY_c40 = (code *)0x108b74;
  fVar1 = fdb_commit(pfStack_c30,'\x01');
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcVar4 = (char *)0x0;
    pfVar7 = (fdb_kvs_handle *)&pfStack_c28;
    ppfVar14 = &pfStack_c20;
    while( true ) {
      pcStackY_c40 = (code *)0x108ba7;
      fVar1 = fdb_iterator_init(apfStack_c18[(long)pcVar4],(fdb_iterator **)pfVar7,(void *)0x0,0,
                                (void *)0x0,0,0);
      if (fVar1 != FDB_RESULT_SUCCESS) break;
      uVar10 = 7;
      do {
        pcStackY_c40 = (code *)0x108bc1;
        fVar1 = fdb_iterator_get(pfStack_c28,(fdb_doc **)ppfVar14);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00108c7f;
        pcStackY_c40 = (code *)0x108bd3;
        fdb_doc_free((fdb_doc *)pfStack_c20);
        pfStack_c20 = (fdb_kvs_handle *)0x0;
        pcStackY_c40 = (code *)0x108be6;
        fVar1 = fdb_iterator_next(pfStack_c28);
        uVar8 = (int)uVar10 - 1;
        uVar10 = (ulong)uVar8;
      } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
      if (uVar8 != 0) goto LAB_00108c98;
      pcStackY_c40 = (code *)0x108bff;
      fdb_iterator_close(pfStack_c28);
      pcVar4 = pcVar4 + 1;
      if (pcVar4 == (char *)0x8) {
        pcStackY_c40 = (code *)0x108c17;
        fdb_commit(pfStack_c30,'\x01');
        pcStackY_c40 = (code *)0x108c21;
        fdb_close(pfStack_c30);
        pcStackY_c40 = (code *)0x108c26;
        fdb_shutdown();
        pcStackY_c40 = (code *)0x108c2b;
        memleak_end();
        pcStackY_c40 = (code *)0x108c37;
        system("rm -rf  e2edb_main > errorlog.txt");
        pcVar11 = "%s PASSED\n";
        if (e2e_multi_kvs_concurrent_wr()::__test_pass != '\0') {
          pcVar11 = "%s FAILED\n";
        }
        pcStackY_c40 = (code *)0x108c68;
        fprintf(_stderr,pcVar11,"TEST: e2e multi kvs concurrent wr test");
        return;
      }
    }
LAB_00108c93:
    pcStackY_c40 = (code *)0x108c98;
    e2e_multi_kvs_concurrent_wr();
LAB_00108c98:
    pcStackY_c40 = (code *)0x108c9d;
    e2e_multi_kvs_concurrent_wr();
  }
  pcStackY_c40 = e2e_multi_kvs_concurrent_wr_compact;
  e2e_multi_kvs_concurrent_wr();
  pfStackY_c68 = pfVar7;
  pcStackY_c60 = pcVar11;
  uStackY_c58 = uVar9;
  ppfStackY_c50 = ppfVar14;
  pcStackY_c48 = pcVar4;
  pcStackY_c40 = (code *)uVar10;
  gettimeofday(&tStackY_f40,(__timezone_ptr_t)0x0);
  memleak_start();
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  rm_storage_fs();
  system("rm -rf  e2edb_ex* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStackY_de8.compaction_mode = '\0';
  ppfVar14 = apfStackY_f30;
  uVar10 = 0;
  iVar2 = 0;
  do {
    sprintf(acStackY_e30,"e2edb_ex%d",uVar10 & 0xffffffff);
    ptr_fhandle = (fdb_file_handle *)((long)&fStackY_f80 + uVar10 * 8);
    pcVar11 = acStackY_e30;
    pfVar7 = (fdb_kvs_handle *)ptr_fhandle;
    fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,acStackY_e30,&fStackY_de8);
    uVar8 = (uint)pcVar11;
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_00108eb3:
      e2e_multi_kvs_concurrent_wr_compact();
      goto LAB_00108eb8;
    }
    lVar6 = 0;
    ptr_handle = ppfVar14;
    do {
      sprintf(acStackY_e30,"e2edb_kv%d",(ulong)(uint)((int)lVar6 + iVar2));
      pfVar7 = ptr_fhandle->root;
      ppfVar12 = ptr_handle;
      fVar1 = fdb_kvs_open((fdb_file_handle *)pfVar7,ptr_handle,acStackY_e30,
                           (fdb_kvs_config *)auStackY_f58);
      uVar8 = (uint)ppfVar12;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        e2e_multi_kvs_concurrent_wr_compact();
        goto LAB_00108eb3;
      }
      lVar6 = lVar6 + 1;
      ptr_handle = ptr_handle + 1;
    } while (lVar6 != 4);
    uVar10 = uVar10 + 1;
    iVar2 = iVar2 + 4;
    ppfVar14 = ppfVar14 + 4;
  } while (uVar10 != 4);
  lVar6 = 0;
  do {
    pfVar7 = *(fdb_kvs_handle **)((long)&fStackY_f80 + lVar6 * 8);
    uVar8 = 1;
    fVar1 = fdb_commit((fdb_file_handle *)pfVar7,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00108eb8;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  lVar6 = 0;
  do {
    pthread_create((pthread_t *)((long)apStackY_eb0 + lVar6),(pthread_attr_t *)0x0,update_thread,
                   *(void **)((long)apfStackY_f30 + lVar6));
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x80);
  lVar6 = 0;
  do {
    pthread_join(*(pthread_t *)((long)apStackY_eb0 + lVar6),(void **)((long)apvStackY_cf0 + lVar6));
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x80);
  lVar6 = 0;
  while( true ) {
    pfVar7 = *(fdb_kvs_handle **)((long)&fStackY_f80 + lVar6 * 8);
    uVar8 = 1;
    fVar1 = fdb_commit((fdb_file_handle *)pfVar7,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    lVar6 = lVar6 + 1;
    if (lVar6 == 4) {
      lVar6 = 0;
      do {
        fdb_close(*(fdb_file_handle **)((long)&fStackY_f80 + lVar6 * 8));
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      fdb_shutdown();
      memleak_end();
      pcVar11 = "%s PASSED\n";
      if (e2e_multi_kvs_concurrent_wr_compact()::__test_pass != '\0') {
        pcVar11 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar11,"TEST: e2e multi kvs concurrent wr test with compaction");
      return;
    }
  }
LAB_00108ebd:
  e2e_multi_kvs_concurrent_wr_compact();
  if (0 < (int)uVar8) {
    uVar10 = 0;
    do {
      iVar2 = rand();
      *(char *)((long)&((fdb_file_handle *)pfVar7)->root + uVar10) =
           "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"
           [(ulong)(long)iVar2 % 0x3e];
      uVar10 = uVar10 + 1;
    } while (uVar8 != uVar10);
    *(undefined1 *)((long)pfVar7 + ((ulong)uVar8 - 1)) = 0;
  }
  return;
LAB_001087e8:
  pcStack_5f0 = (code *)0x1087ed;
  e2e_crash_recover_test();
LAB_001087ed:
  pcStack_5f0 = (code *)0x1087f2;
  e2e_crash_recover_test();
  goto LAB_001087f2;
LAB_00108c7f:
  pcStackY_c40 = (code *)0x108c84;
  e2e_multi_kvs_concurrent_wr();
LAB_00108c84:
  pcStackY_c40 = (code *)0x108c89;
  e2e_multi_kvs_concurrent_wr();
LAB_00108c89:
  pcStackY_c40 = (code *)0x108c8e;
  e2e_multi_kvs_concurrent_wr();
LAB_00108c8e:
  pcStackY_c40 = (code *)0x108c93;
  e2e_multi_kvs_concurrent_wr();
  goto LAB_00108c93;
LAB_00108eb8:
  e2e_multi_kvs_concurrent_wr_compact();
  goto LAB_00108ebd;
}

Assistant:

void e2e_crash_recover_test(bool do_rollback) {

    TEST_INIT();
    memleak_start();

    randomize();

    bool walflush = true;
    int i, n;
    int n_checkpoints =  2;

    rm_storage_fs();
    storage_t *st;
    checkpoint_t verification_checkpoint;
    idx_prams_t index_params;
    fdb_kvs_handle *snap_db;
    fdb_kvs_info info;
    fdb_status status;

    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.durability_opt = FDB_DRB_ASYNC;
    fconfig.purging_interval = 30; // retain deleted docs for iteration

    gen_index_params(&index_params);
    memset(&verification_checkpoint, 0, sizeof(checkpoint_t));
    st = init_storage(&fconfig, &fconfig, &kvs_config,
                      &index_params, &verification_checkpoint, walflush);

    for (i = 0; i < 100; ++i) {
        load_persons(st);
        e2e_fdb_commit(st->main, true);
    }

    fdb_seqnum_t seqno;
    uint64_t k, num_markers;
    fdb_snapshot_info_t *markers;

    if (do_rollback) {
        status = fdb_get_all_snap_markers(st->main, &markers,
                                          &num_markers);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        for (k = 0; k < num_markers; k += 10) {
            // rollback to each marker
            seqno = markers[k].kvs_markers[0].seqnum;
            status = fdb_rollback(&st->all_docs, seqno);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
        fdb_free_snap_markers(markers, num_markers);
    } else {
        status = fdb_get_all_snap_markers(st->main, &markers,
                                          &num_markers);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        for (k = 0; k < num_markers; k += 10) {
            load_persons(st);
        }
        fdb_free_snap_markers(markers, num_markers);
    }

    // close storage
    e2e_fdb_close(st);

    corrupt_latest_superblock(E2EDB_MAIN);

    // reopen storage
    gen_index_params(&index_params);
    memset(&verification_checkpoint, 0, sizeof(checkpoint_t));
    st = init_storage(&fconfig, &fconfig, &kvs_config,
                      &index_params, &verification_checkpoint, walflush);

    // run verifiable workload
    for (n = 0; n < n_checkpoints; ++n) {
        load_persons(st);
        for (i = 0; i < 100; ++i) {
            load_persons(st);
            e2e_fdb_commit(st->main, walflush);
            status = fdb_get_kvs_info(st->all_docs, &info);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            fdb_snapshot_open(st->all_docs, &snap_db, info.last_seqnum);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            update_index(st, true);
            verify_db(st);
            fdb_kvs_close(snap_db);
        }
    }

    // teardown
    e2e_fdb_shutdown(st);
    memleak_end();
    if (do_rollback) {
        TEST_RESULT("TEST: e2e crash recover test with rollback");
    } else {
        TEST_RESULT("TEST: e2e crash recover test");
    }
}